

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QLayout *layout)

{
  QFormLayoutPrivate *this_00;
  bool bVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QFormLayoutItem *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFormLayoutPrivate **)&(this->super_QLayout).field_0x8;
  bVar1 = QLayoutPrivate::checkLayout(&this_00->super_QLayoutPrivate,layout);
  if (bVar1) {
    uVar2 = (uint)((ulong)(this_00->m_matrix).m_storage.d.size >> 1);
    if (uVar2 < (uint)row) {
      row = uVar2;
    }
    local_30 = (QFormLayoutItem *)0x0;
    QtPrivate::FixedColumnMatrix<QFormLayoutItem_*,_2>::insertRow(&this_00->m_matrix,row,&local_30);
    QFormLayoutPrivate::setLayout(this_00,row,SpanningRole,layout);
    (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFormLayout::insertRow(int row, QLayout *layout)
{
    Q_D(QFormLayout);
    if (!d->checkLayout(layout))
        return;

    row = d->insertRow(row);
    d->setLayout(row, SpanningRole, layout);
    invalidate();
}